

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O1

void __thiscall
btSimpleBroadphase::btSimpleBroadphase
          (btSimpleBroadphase *this,int maxProxies,btOverlappingPairCache *overlappingPairCache)

{
  btHashedOverlappingPairCache *this_00;
  btSimpleBroadphaseProxy *pbVar1;
  int iVar2;
  btSimpleBroadphaseProxy *pbVar3;
  long lVar4;
  long lVar5;
  
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btSimpleBroadphase_00223540;
  this->m_pairCache = overlappingPairCache;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  if (overlappingPairCache == (btOverlappingPairCache *)0x0) {
    this_00 = (btHashedOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(this_00);
    this->m_pairCache = (btOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  lVar5 = (long)maxProxies;
  pbVar1 = (btSimpleBroadphaseProxy *)btAlignedAllocInternal(lVar5 * 0x40,0x10);
  this->m_pHandlesRawPtr = pbVar1;
  if (maxProxies != 0) {
    pbVar3 = pbVar1;
    do {
      (pbVar3->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
      (pbVar3->super_btBroadphaseProxy).m_multiSapParentProxy = (void *)0x0;
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1 + lVar5);
  }
  this->m_pHandles = pbVar1;
  this->m_maxHandles = maxProxies;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 0;
  this->m_LastHandleIndex = -1;
  if (0 < maxProxies) {
    iVar2 = 2;
    lVar4 = 0;
    do {
      *(int *)((long)(&(pbVar1->super_btBroadphaseProxy).m_aabbMax + 1) + lVar4) = iVar2 + -1;
      *(int *)((long)(pbVar1->super_btBroadphaseProxy).m_aabbMin.m_floats + lVar4 + -4) = iVar2;
      iVar2 = iVar2 + 1;
      lVar4 = lVar4 + 0x40;
    } while ((ulong)(uint)maxProxies << 6 != lVar4);
  }
  *(undefined4 *)&pbVar1[lVar5 + -1].super_btBroadphaseProxy.field_0x3c = 0;
  return;
}

Assistant:

btSimpleBroadphase::btSimpleBroadphase(int maxProxies, btOverlappingPairCache* overlappingPairCache)
	:m_pairCache(overlappingPairCache),
	m_ownsPairCache(false),
	m_invalidPair(0)
{

	if (!overlappingPairCache)
	{
		void* mem = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new (mem)btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = btAlignedAlloc(sizeof(btSimpleBroadphaseProxy)*maxProxies,16);
	m_pHandles = new(m_pHandlesRawPtr) btSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;
	

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i+2;//any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	
	}

}